

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_9::MmapDisposer::disposeImpl
          (MmapDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  int iVar1;
  MmapRange MVar2;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  MVar2 = getMmapRange((uint64_t)firstElement,elementSize * elementCount);
  do {
    iVar1 = munmap((void *)MVar2.offset,MVar2.size);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_30.exception = (Exception *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    kj::_::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  return;
}

Assistant:

void disposeImpl(void* firstElement, size_t elementSize, size_t elementCount,
                   size_t capacity, void (*destroyElement)(void*)) const override {
    auto range = getMmapRange(reinterpret_cast<uintptr_t>(firstElement),
                              elementSize * elementCount);
    KJ_SYSCALL(munmap(reinterpret_cast<byte*>(range.offset), range.size)) { break; }
  }